

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::Y_formatter<spdlog::details::null_scoped_padder>::format
          (Y_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  int iVar2;
  uint value;
  format_int fStack_38;
  
  iVar2 = tm_time->tm_year;
  uVar1 = iVar2 + 0x76c;
  value = -uVar1;
  if (0 < (int)uVar1) {
    value = uVar1;
  }
  fStack_38.str_ = fmt::v7::format_int::format_unsigned<unsigned_int>(&fStack_38,value);
  if (iVar2 < -0x76c) {
    fStack_38.str_[-1] = '-';
    fStack_38.str_ = fStack_38.str_ + -1;
  }
  if (-0x16 < (long)&fStack_38 - (long)fStack_38.str_) {
    fmt::v7::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,fStack_38.str_,
               fStack_38.str_ + ((long)&fStack_38 - (long)fStack_38.str_) + 0x15);
    return;
  }
  fmt::v7::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/spdlog/spdlog/fmt/bundled/core.h"
             ,0x146,"negative value");
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 4;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }